

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cc
# Opt level: O1

void __thiscall hrvo::KdTree::queryRecursive(KdTree *this,Agent *agent,float *rangeSq,size_t node)

{
  pointer pNVar1;
  size_t node_00;
  size_t *psVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar9;
  undefined1 auVar8 [16];
  
  do {
    pNVar1 = (this->nodes_).
             super__Vector_base<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar3 = pNVar1[node].begin_;
    if (pNVar1[node].end_ - sVar3 < 0xb) {
      for (; sVar3 < (this->nodes_).
                     super__Vector_base<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>.
                     _M_impl.super__Vector_impl_data._M_start[node].end_; sVar3 = sVar3 + 1) {
        Agent::insertNeighbor
                  (agent,(this->agents_).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[sVar3],rangeSq);
      }
      return;
    }
    sVar3 = pNVar1[node].left_;
    node_00 = pNVar1[node].right_;
    fVar7 = (agent->position_).x_;
    fVar9 = (agent->position_).y_;
    auVar5._0_4_ = pNVar1[sVar3].minX_ - fVar7;
    auVar5._4_4_ = pNVar1[node_00].minX_ - fVar7;
    auVar5._8_4_ = 0.0 - fVar7;
    auVar5._12_4_ = 0.0 - fVar7;
    auVar5 = maxps(auVar5,ZEXT816(0));
    auVar6._0_4_ = fVar7 - pNVar1[sVar3].maxX_;
    auVar6._4_4_ = fVar7 - pNVar1[node_00].maxX_;
    auVar6._8_4_ = fVar7 - 0.0;
    auVar6._12_4_ = fVar7 - 0.0;
    auVar6 = maxps(auVar6,ZEXT816(0));
    auVar4._0_4_ = pNVar1[sVar3].minY_ - fVar9;
    auVar4._4_4_ = pNVar1[node_00].minY_ - fVar9;
    auVar4._8_4_ = 0.0 - fVar9;
    auVar4._12_4_ = 0.0 - fVar9;
    auVar4 = maxps(auVar4,ZEXT816(0));
    auVar8._0_4_ = fVar9 - pNVar1[sVar3].maxY_;
    auVar8._4_4_ = fVar9 - pNVar1[node_00].maxY_;
    auVar8._8_4_ = fVar9 - 0.0;
    auVar8._12_4_ = fVar9 - 0.0;
    auVar8 = maxps(auVar8,ZEXT816(0));
    fVar7 = auVar8._0_4_ * auVar8._0_4_ +
            auVar4._0_4_ * auVar4._0_4_ + auVar5._0_4_ * auVar5._0_4_ + auVar6._0_4_ * auVar6._0_4_;
    fVar9 = auVar8._4_4_ * auVar8._4_4_ +
            auVar4._4_4_ * auVar4._4_4_ + auVar5._4_4_ * auVar5._4_4_ + auVar6._4_4_ * auVar6._4_4_;
    if (fVar9 <= fVar7) {
      if (*rangeSq <= fVar9) {
        return;
      }
      queryRecursive(this,agent,rangeSq,node_00);
      if (*rangeSq <= fVar7) {
        return;
      }
      psVar2 = &(this->nodes_).
                super__Vector_base<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>._M_impl.
                super__Vector_impl_data._M_start[node].left_;
    }
    else {
      if (*rangeSq <= fVar7) {
        return;
      }
      queryRecursive(this,agent,rangeSq,sVar3);
      if (*rangeSq <= fVar9) {
        return;
      }
      psVar2 = &(this->nodes_).
                super__Vector_base<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>._M_impl.
                super__Vector_impl_data._M_start[node].right_;
    }
    node = *psVar2;
  } while( true );
}

Assistant:

void KdTree::queryRecursive(Agent *agent, float &rangeSq,
                            std::size_t node) const {
  if (nodes_[node].end_ - nodes_[node].begin_ <= HRVO_MAX_LEAF_SIZE) {
    for (std::size_t i = nodes_[node].begin_; i < nodes_[node].end_; ++i) {
      agent->insertNeighbor(agents_[i], rangeSq);
    }
  } else {
    const float distLeftMinX = std::max(
        0.0F, nodes_[nodes_[node].left_].minX_ - agent->position_.getX());
    const float distLeftMaxX = std::max(
        0.0F, agent->position_.getX() - nodes_[nodes_[node].left_].maxX_);
    const float distLeftMinY = std::max(
        0.0F, nodes_[nodes_[node].left_].minY_ - agent->position_.getY());
    const float distLeftMaxY = std::max(
        0.0F, agent->position_.getY() - nodes_[nodes_[node].left_].maxY_);

    const float distSqLeft =
        distLeftMinX * distLeftMinX + distLeftMaxX * distLeftMaxX +
        distLeftMinY * distLeftMinY + distLeftMaxY * distLeftMaxY;

    const float distRightMinX = std::max(
        0.0F, nodes_[nodes_[node].right_].minX_ - agent->position_.getX());
    const float distRightMaxX = std::max(
        0.0F, agent->position_.getX() - nodes_[nodes_[node].right_].maxX_);
    const float distRightMinY = std::max(
        0.0F, nodes_[nodes_[node].right_].minY_ - agent->position_.getY());
    const float distRightMaxY = std::max(
        0.0F, agent->position_.getY() - nodes_[nodes_[node].right_].maxY_);

    const float distSqRight =
        distRightMinX * distRightMinX + distRightMaxX * distRightMaxX +
        distRightMinY * distRightMinY + distRightMaxY * distRightMaxY;

    if (distSqLeft < distSqRight) {
      if (distSqLeft < rangeSq) {
        queryRecursive(agent, rangeSq, nodes_[node].left_);

        if (distSqRight < rangeSq) {
          queryRecursive(agent, rangeSq, nodes_[node].right_);
        }
      }
    } else {
      if (distSqRight < rangeSq) {
        queryRecursive(agent, rangeSq, nodes_[node].right_);

        if (distSqLeft < rangeSq) {
          queryRecursive(agent, rangeSq, nodes_[node].left_);
        }
      }
    }
  }
}